

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void multi_xfer_bufs_free(Curl_multi *multi)

{
  (*Curl_cfree)(multi->xfer_buf);
  multi->xfer_buf = (char *)0x0;
  multi->xfer_buf_len = 0;
  multi->field_0x271 = multi->field_0x271 & 0xdf;
  (*Curl_cfree)(multi->xfer_ulbuf);
  multi->xfer_ulbuf = (char *)0x0;
  multi->xfer_ulbuf_len = 0;
  multi->field_0x271 = multi->field_0x271 & 0xbf;
  (*Curl_cfree)(multi->xfer_sockbuf);
  multi->xfer_sockbuf = (char *)0x0;
  multi->xfer_sockbuf_len = 0;
  multi->field_0x271 = multi->field_0x271 & 0x7f;
  return;
}

Assistant:

static void multi_xfer_bufs_free(struct Curl_multi *multi)
{
  DEBUGASSERT(multi);
  Curl_safefree(multi->xfer_buf);
  multi->xfer_buf_len = 0;
  multi->xfer_buf_borrowed = FALSE;
  Curl_safefree(multi->xfer_ulbuf);
  multi->xfer_ulbuf_len = 0;
  multi->xfer_ulbuf_borrowed = FALSE;
  Curl_safefree(multi->xfer_sockbuf);
  multi->xfer_sockbuf_len = 0;
  multi->xfer_sockbuf_borrowed = FALSE;
}